

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void insert_flipped_container
               (roaring_array_t *ans_arr,roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,
               uint16_t lb_end)

{
  ushort uVar1;
  bool bVar2;
  run_container_t *c;
  _Bool _Var3;
  uint8_t uVar4;
  uint uVar5;
  uint uVar6;
  array_container_t *paVar7;
  int iVar8;
  run_container_t *run;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint8_t uVar12;
  run_container_t *local_30;
  
  iVar8 = x1_arr->size;
  if (((long)iVar8 == 0) || (x1_arr->keys[(long)iVar8 + -1] == hb)) {
    uVar5 = iVar8 - 1;
  }
  else {
    uVar6 = iVar8 - 1;
    uVar9 = 0;
    uVar10 = uVar6;
    do {
      if ((int)uVar6 < (int)uVar9) {
        uVar5 = ~uVar9;
        break;
      }
      uVar5 = uVar9 + uVar6 >> 1;
      uVar1 = *(ushort *)((long)x1_arr->keys + (ulong)(uVar9 + uVar6 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar9 = uVar5 + 1;
        bVar2 = true;
        uVar5 = uVar10;
      }
      else if (hb < uVar1) {
        uVar6 = uVar5 - 1;
        bVar2 = true;
        uVar5 = uVar10;
      }
      else {
        bVar2 = false;
      }
      uVar10 = uVar5;
    } while (bVar2);
  }
  iVar8 = ans_arr->size;
  if (((long)iVar8 == 0) || (ans_arr->keys[(long)iVar8 + -1] == hb)) {
    uVar10 = iVar8 - 1;
  }
  else {
    uVar11 = iVar8 - 1;
    uVar9 = 0;
    uVar6 = uVar11;
    do {
      if ((int)uVar11 < (int)uVar9) {
        uVar10 = ~uVar9;
        break;
      }
      uVar10 = uVar9 + uVar11 >> 1;
      uVar1 = *(ushort *)((long)ans_arr->keys + (ulong)(uVar9 + uVar11 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar9 = uVar10 + 1;
        bVar2 = true;
        uVar10 = uVar6;
      }
      else if (hb < uVar1) {
        uVar11 = uVar10 - 1;
        bVar2 = true;
        uVar10 = uVar6;
      }
      else {
        bVar2 = false;
      }
      uVar6 = uVar10;
    } while (bVar2);
  }
  if ((int)uVar5 < 0) {
    uVar5 = (uint)lb_start;
    iVar8 = lb_end - uVar5;
    if (iVar8 + 2U < 3) {
      paVar7 = array_container_create_range(uVar5,lb_end + 1);
      uVar12 = '\x02';
    }
    else {
      paVar7 = (array_container_t *)run_container_create_given_capacity(1);
      uVar12 = '\x03';
      if (paVar7 != (array_container_t *)0x0) {
        *(uint *)(paVar7->array + (long)paVar7->cardinality * 2) = iVar8 * 0x10000 | uVar5;
        paVar7->cardinality = paVar7->cardinality + 1;
      }
    }
    ra_insert_new_key_value_at(ans_arr,~uVar10,hb,paVar7,uVar12);
    return;
  }
  uVar12 = x1_arr->typecodes[uVar5 & 0xffff];
  paVar7 = (array_container_t *)x1_arr->containers[uVar5 & 0xffff];
  if (uVar12 == '\x04') {
    uVar12 = *(uint8_t *)&paVar7->array;
    paVar7 = *(array_container_t **)paVar7;
  }
  uVar5 = (uint)lb_start;
  iVar8 = lb_end + 1;
  local_30 = (run_container_t *)0x0;
  if (uVar12 == '\x03') {
    iVar8 = run_container_negation_range((run_container_t *)paVar7,uVar5,iVar8,&local_30);
    uVar12 = (uint8_t)iVar8;
  }
  else {
    if (uVar12 == '\x02') {
      _Var3 = array_container_negation_range(paVar7,uVar5,iVar8,&local_30);
    }
    else {
      _Var3 = bitset_container_negation_range((bitset_container_t *)paVar7,uVar5,iVar8,&local_30);
    }
    uVar12 = '\x02' - _Var3;
  }
  c = local_30;
  run = local_30;
  uVar4 = uVar12;
  if (uVar12 == '\x04') {
    uVar4 = *(uint8_t *)&local_30->runs;
    run = *(run_container_t **)local_30;
  }
  if (uVar4 == '\x03') {
    iVar8 = run_container_cardinality(run);
  }
  else {
    iVar8 = run->n_runs;
  }
  if (iVar8 == 0) {
    container_free(c,uVar12);
  }
  else {
    ra_insert_new_key_value_at(ans_arr,~uVar10,hb,c,uVar12);
  }
  return;
}

Assistant:

static void insert_flipped_container(roaring_array_t *ans_arr,
                                     const roaring_array_t *x1_arr, uint16_t hb,
                                     uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    const int j = ra_get_index(ans_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container =
            container_not_range(container_to_flip, ctype_in, (uint32_t)lb_start,
                                (uint32_t)(lb_end + 1), &ctype_out);

        if (container_get_cardinality(flipped_container, ctype_out))
            ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                       ctype_out);
        else {
            container_free(flipped_container, ctype_out);
        }
    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                   ctype_out);
    }
}